

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O0

void __thiscall
anon_unknown.dwarf_37c900::TransformSelectorIndexes::Transform
          (TransformSelectorIndexes *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *list,transform_type *transform)

{
  bool bVar1;
  size_type sVar2;
  reference piVar3;
  reference pvVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  int local_3c;
  iterator iStack_38;
  int index;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  transform_type *transform_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *list_local;
  TransformSelectorIndexes *this_local;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(list);
  (*(this->super_TransformSelector)._vptr_TransformSelector[2])(this,sVar2);
  __end2 = std::vector<int,_std::allocator<int>_>::begin(&this->Indexes);
  iStack_38 = std::vector<int,_std::allocator<int>_>::end(&this->Indexes);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end2);
    local_3c = *piVar3;
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](list,(long)local_3c);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(&local_60,transform,pvVar4);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](list,(long)local_3c);
    std::__cxx11::string::operator=((string *)pvVar4,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end2);
  }
  return;
}

Assistant:

void Transform(std::vector<std::string>& list,
                 const transform_type& transform) override
  {
    this->Validate(list.size());

    for (auto index : this->Indexes) {
      list[index] = transform(list[index]);
    }
  }